

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1cfc8e::PeerManagerImpl::UpdateBlockAvailability
          (PeerManagerImpl *this,NodeId nodeid,uint256 *hash)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  CNodeState *pCVar5;
  CBlockIndex *pCVar6;
  long in_FS_OFFSET;
  base_uint<256U> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar5 = State(this,nodeid);
  if (pCVar5 == (CNodeState *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x5ce,
                  "void (anonymous namespace)::PeerManagerImpl::UpdateBlockAvailability(NodeId, const uint256 &)"
                 );
  }
  ProcessBlockAvailability(this,nodeid);
  pCVar6 = ::node::BlockManager::LookupBlockIndex(&this->m_chainman->m_blockman,hash);
  if (pCVar6 != (CBlockIndex *)0x0) {
    base_uint<256U>::base_uint(&local_50,0);
    bVar4 = operator>(&(pCVar6->nChainWork).super_base_uint<256U>,&local_50);
    if (bVar4) {
      if (pCVar5->pindexBestKnownBlock != (CBlockIndex *)0x0) {
        bVar4 = operator>=(&(pCVar6->nChainWork).super_base_uint<256U>,
                           &(pCVar5->pindexBestKnownBlock->nChainWork).super_base_uint<256U>);
        if (!bVar4) goto LAB_001af4c2;
      }
      pCVar5->pindexBestKnownBlock = pCVar6;
      goto LAB_001af4c2;
    }
  }
  uVar1 = *(undefined8 *)(hash->super_base_blob<256U>).m_data._M_elems;
  uVar2 = *(undefined8 *)((hash->super_base_blob<256U>).m_data._M_elems + 8);
  uVar3 = *(undefined8 *)((hash->super_base_blob<256U>).m_data._M_elems + 0x18);
  *(undefined8 *)((pCVar5->hashLastUnknownBlock).super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((hash->super_base_blob<256U>).m_data._M_elems + 0x10);
  *(undefined8 *)((pCVar5->hashLastUnknownBlock).super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar3;
  *(undefined8 *)(pCVar5->hashLastUnknownBlock).super_base_blob<256U>.m_data._M_elems = uVar1;
  *(undefined8 *)((pCVar5->hashLastUnknownBlock).super_base_blob<256U>.m_data._M_elems + 8) = uVar2;
LAB_001af4c2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::UpdateBlockAvailability(NodeId nodeid, const uint256 &hash) {
    CNodeState *state = State(nodeid);
    assert(state != nullptr);

    ProcessBlockAvailability(nodeid);

    const CBlockIndex* pindex = m_chainman.m_blockman.LookupBlockIndex(hash);
    if (pindex && pindex->nChainWork > 0) {
        // An actually better block was announced.
        if (state->pindexBestKnownBlock == nullptr || pindex->nChainWork >= state->pindexBestKnownBlock->nChainWork) {
            state->pindexBestKnownBlock = pindex;
        }
    } else {
        // An unknown block was announced; just assume that the latest one is the best one.
        state->hashLastUnknownBlock = hash;
    }
}